

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O3

void render_url_escaped(MD_HTML *r,MD_CHAR *data,MD_SIZE size)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  void *pvVar6;
  MD_SIZE MVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  char hex [3];
  char local_3b;
  MD_CHAR local_3a;
  MD_CHAR local_39;
  ulong local_38;
  
  if (size != 0) {
    local_38 = (ulong)size;
    uVar1 = local_38 - 1;
    uVar10 = 0;
    do {
      uVar8 = (ulong)uVar10;
      bVar11 = true;
      uVar5 = uVar8;
      uVar4 = uVar10;
      if ((r->escape_map[(byte)data[uVar8]] & 2U) == 0) {
        do {
          if (uVar1 == uVar5) {
            bVar11 = false;
            uVar5 = local_38;
            goto LAB_0010de77;
          }
          lVar3 = uVar5 + 1;
          uVar5 = uVar5 + 1;
        } while ((r->escape_map[(byte)data[lVar3]] & 2U) == 0);
        bVar11 = uVar5 < local_38;
LAB_0010de77:
        uVar4 = (uint)uVar5;
      }
      if (uVar10 <= uVar4 && uVar4 - uVar10 != 0) {
        (*r->process_output)(data + uVar8,uVar4 - uVar10,r->userdata);
      }
      if (!bVar11) {
        return;
      }
      bVar2 = data[uVar4];
      if (bVar2 == 0x26) {
        pvVar6 = r->userdata;
        pcVar9 = "&amp;";
        MVar7 = 5;
      }
      else {
        local_3b = '%';
        local_3a = "0123456789ABCDEF"[bVar2 >> 4];
        local_39 = "0123456789ABCDEF"[bVar2 & 0xf];
        pvVar6 = r->userdata;
        pcVar9 = &local_3b;
        MVar7 = 3;
      }
      (*r->process_output)(pcVar9,MVar7,pvVar6);
      uVar10 = uVar4 + 1;
    } while (uVar10 < size);
  }
  return;
}

Assistant:

static void
render_url_escaped(MD_HTML* r, const MD_CHAR* data, MD_SIZE size)
{
    static const MD_CHAR hex_chars[] = "0123456789ABCDEF";
    MD_OFFSET beg = 0;
    MD_OFFSET off = 0;

    /* Some characters need to be escaped in URL attributes. */
    #define NEED_URL_ESC(ch)    (r->escape_map[(unsigned char)(ch)] & NEED_URL_ESC_FLAG)

    while(1) {
        while(off < size  &&  !NEED_URL_ESC(data[off]))
            off++;
        if(off > beg)
            render_verbatim(r, data + beg, off - beg);

        if(off < size) {
            char hex[3];

            switch(data[off]) {
                case '&':   RENDER_VERBATIM(r, "&amp;"); break;
                default:
                    hex[0] = '%';
                    hex[1] = hex_chars[((unsigned)data[off] >> 4) & 0xf];
                    hex[2] = hex_chars[((unsigned)data[off] >> 0) & 0xf];
                    render_verbatim(r, hex, 3);
                    break;
            }
            off++;
        } else {
            break;
        }

        beg = off;
    }
}